

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::IsRelaxable(RelaxFloatOpsPass *this,Instruction *inst)

{
  IRContext *this_00;
  uint32_t uVar1;
  const_iterator cVar2;
  FeatureManager *pFVar3;
  const_iterator cVar4;
  bool bVar5;
  uint uVar6;
  uint32_t local_30;
  Op local_2c;
  Op local_28;
  Op local_24;
  
  local_24 = inst->opcode_;
  cVar2 = std::
          _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->target_ops_core_f_rslt_)._M_h,&local_24);
  bVar5 = true;
  if (cVar2.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
    local_28 = inst->opcode_;
    cVar2 = std::
            _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->target_ops_core_f_opnd_)._M_h,&local_28);
    if (cVar2.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
      local_2c = inst->opcode_;
      cVar2 = std::
              _Hashtable<spv::Op,_spv::Op,_std::allocator<spv::Op>,_std::__detail::_Identity,_std::equal_to<spv::Op>,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->sample_ops_)._M_h,&local_2c);
      if (cVar2.super__Node_iterator_base<spv::Op,_false>._M_cur == (__node_type *)0x0) {
        if (inst->opcode_ == OpExtInst) {
          uVar1 = (inst->has_result_id_ & 1) + 1;
          if (inst->has_type_id_ == false) {
            uVar1 = (uint)inst->has_result_id_;
          }
          uVar1 = Instruction::GetSingleWordOperand(inst,uVar1);
          this_00 = (this->super_Pass).context_;
          pFVar3 = (this_00->feature_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                   .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
          if (pFVar3 == (FeatureManager *)0x0) {
            IRContext::AnalyzeFeatures(this_00);
            pFVar3 = (this_00->feature_mgr_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                     .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl;
          }
          if (uVar1 == pFVar3->extinst_importid_GLSLstd450_) {
            uVar6 = (inst->has_result_id_ & 1) + 1;
            if (inst->has_type_id_ == false) {
              uVar6 = (uint)inst->has_result_id_;
            }
            local_30 = Instruction::GetSingleWordOperand(inst,uVar6 + 1);
            cVar4 = std::
                    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    ::find(&(this->target_ops_450_)._M_h,&local_30);
            return cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0
            ;
          }
        }
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

bool RelaxFloatOpsPass::IsRelaxable(Instruction* inst) {
  return target_ops_core_f_rslt_.count(inst->opcode()) != 0 ||
         target_ops_core_f_opnd_.count(inst->opcode()) != 0 ||
         sample_ops_.count(inst->opcode()) != 0 ||
         (inst->opcode() == spv::Op::OpExtInst &&
          inst->GetSingleWordInOperand(0) ==
              context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
          target_ops_450_.count(inst->GetSingleWordInOperand(1)) != 0);
}